

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::PatchSetPropertyScoped<true,Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,FrameDisplay *pDisplay,PropertyId propertyId,
               Var newValue,Var defaultInstance,PropertyOperationFlags propertyOperationFlags)

{
  DisableImplicitFlags DVar1;
  ushort uVar2;
  Type *typeWithoutProperty;
  code *pcVar3;
  Var propertyValue;
  bool bVar4;
  BOOL BVar5;
  DescriptorFlags DVar6;
  undefined4 *puVar7;
  void *pvVar8;
  RecyclableObject *pRVar9;
  GlobalObject *instance;
  PropertyRecord *pPVar10;
  uint index;
  uint uVar11;
  bool bVar12;
  ScriptContext *pSVar13;
  undefined1 local_120 [8];
  PropertyValueInfo info;
  PropertyValueInfo info2;
  Var value;
  BOOL local_5c;
  FrameDisplay *pFStack_58;
  BOOL setAccessorResult;
  Var local_50;
  InlineCacheIndex local_44;
  ScriptContext *local_40;
  PropertyOperationFlags local_38;
  uint local_34;
  
  local_44 = inlineCacheIndex;
  local_40 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar2 = pDisplay->length;
  local_120 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  pFStack_58 = pDisplay;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_120,functionBody,inlineCache,local_44,false);
  local_38 = propertyOperationFlags & PropertyOperation_AllowUndeclInConsoleScope;
  local_34 = propertyId;
  if (uVar2 != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    index = 0;
    local_50 = newValue;
    do {
      propertyValue = local_50;
      pvVar8 = FrameDisplay::GetItem(pFStack_58,index);
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
      bVar4 = VarIsImpl<Js::ConsoleScopeActivationObject>(pRVar9);
      if ((bVar4) && (index - uVar2 != -1)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xc73,
                                    "(!VarIs<ConsoleScopeActivationObject>(object) || (i == length - 1))"
                                    ,"Invalid location for ConsoleScopeActivationObject");
        if (!bVar4) goto LAB_00adeeba;
        *puVar7 = 0;
      }
      pSVar13 = local_40;
      typeWithoutProperty = (pRVar9->type).ptr;
      bVar4 = CacheOperators::TrySetProperty<true,true,true,true,true,true,false,false>
                        (pRVar9,false,propertyId,propertyValue,local_40,propertyOperationFlags,
                         (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_120);
      if (bVar4) {
        return;
      }
      local_5c = 0;
      bVar4 = SetAccessorOrNonWritableProperty
                        (pRVar9,pRVar9,propertyId,propertyValue,(PropertyValueInfo *)local_120,
                         pSVar13,propertyOperationFlags,false,local_38 != PropertyOperation_None,
                         &local_5c);
      if (bVar4) {
        return;
      }
      BVar5 = IsObject(pRVar9);
      if (BVar5 == 0) {
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,local_40);
      }
      propertyId = local_34;
      BVar5 = HasProperty(pRVar9,local_34);
      pSVar13 = local_40;
      if (BVar5 != 0) {
        DVar1 = local_40->threadContext->disableImplicitFlags;
        local_40->threadContext->disableImplicitFlags = DisableImplicitCallAndExceptionFlag;
        BVar5 = GetProperty_Internal<false>
                          (pRVar9,pRVar9,false,propertyId,(Var *)&info2.inlineCacheIndex,local_40,
                           (PropertyValueInfo *)0x0);
        pSVar13->threadContext->disableImplicitFlags = DVar1;
        if ((((BVar5 != 0) && (propertyId != 0x2d5)) && (local_38 == PropertyOperation_None)) &&
           ((((pSVar13->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
            (UndeclaredBlockVariable *)info2._56_8_)) {
          JavascriptError::ThrowReferenceError(pSVar13,-0x7ff5ec07,(PCWSTR)0x0);
        }
        info.inlineCacheIndex = 0;
        info.isFunctionPIC = false;
        info.allowResizingPolymorphicInlineCache = false;
        info._62_2_ = 0;
        info2.m_instance = (RecyclableObject *)0x50000ffff;
        info2.m_propertyIndex = 0;
        info2.m_attributes = '\0';
        info2.flags = InlineCacheNoFlags;
        info2.cacheInfoFlag = 0;
        info2.inlineCache = (InlineCache *)0x0;
        info2.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
        info2.functionBody = (FunctionBody *)0x0;
        info2.prop = (RecyclableObject *)0x0;
        info2.propertyRecordUsageCache._0_4_ = 0xffffffff;
        info2.propertyRecordUsageCache._5_1_ = 1;
        PropertyValueInfo::SetCacheInfo
                  ((PropertyValueInfo *)&info.inlineCacheIndex,functionBody,inlineCache,local_44,
                   false);
        (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x17])
                  (pRVar9,(ulong)(uint)propertyId,local_50,(ulong)local_38,&info.inlineCacheIndex);
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
        if ((bVar4) && (DAT_015d346a == '\x01')) {
          CacheOperators::TraceCache(inlineCache,L"PatchSetPropertyScoped",local_34,pSVar13,pRVar9);
        }
        bVar12 = local_38 != PropertyOperation_None;
        bVar4 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(pRVar9);
        if (bVar4 || bVar12) {
          return;
        }
        CacheOperators::CachePropertyWrite
                  (pRVar9,false,typeWithoutProperty,local_34,
                   (PropertyValueInfo *)&info.inlineCacheIndex,pSVar13);
        return;
      }
      index = index + 1;
      newValue = local_50;
    } while (index != uVar2);
  }
  if (propertyId == 0x2d5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xcb2,"(!isLexicalThisSlotSymbol)","!isLexicalThisSlotSymbol");
    if (!bVar4) goto LAB_00adeeba;
    *puVar7 = 0;
  }
  uVar11 = (uint)uVar2;
  if (uVar11 != 0) {
    pvVar8 = FrameDisplay::GetItem(pFStack_58,uVar11 - 1);
    bVar4 = VarIs<Js::ConsoleScopeActivationObject>(pvVar8);
    pSVar13 = local_40;
    if (bVar4) {
      local_50 = newValue;
      if (uVar11 != 1) {
        pvVar8 = FrameDisplay::GetItem(pFStack_58,uVar11 - 2);
        bVar4 = VarIs<Js::GlobalObject>(pvVar8);
        if (bVar4) {
          instance = UnsafeVarTo<Js::GlobalObject>(pvVar8);
        }
        else {
          instance = (GlobalObject *)0x0;
        }
        if (instance != (GlobalObject *)0x0) {
          info.inlineCacheIndex = 0;
          info.isFunctionPIC = false;
          info.allowResizingPolymorphicInlineCache = false;
          info._62_2_ = 0;
          DVar6 = GetRootSetter<int>((RecyclableObject *)instance,local_34,
                                     (Var *)&info.inlineCacheIndex,(PropertyValueInfo *)local_120,
                                     pSVar13);
          if ((DVar6 & Accessor) != None) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xcc0,"((flags & Accessor) != Accessor)",
                                        "(flags & Accessor) != Accessor");
            if (!bVar4) goto LAB_00adeeba;
            *puVar7 = 0;
          }
          if ((DVar6 & Proxy) != None) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xcc1,"((flags & Proxy) != Proxy)",
                                        "(flags & Proxy) != Proxy");
            if (!bVar4) goto LAB_00adeeba;
            *puVar7 = 0;
          }
          if ((local_38 == PropertyOperation_None) && ((DVar6 & WritableData) == Data)) {
            if ((DVar6 & Const) != None) {
              JavascriptError::ThrowTypeError(pSVar13,-0x7ff5fbe1,(PCWSTR)0x0);
            }
            if (local_34 != 0x2d5) {
              return;
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xcca,"(!isLexicalThisSlotSymbol)",
                                        "!isLexicalThisSlotSymbol");
            if (bVar4) {
              *puVar7 = 0;
              return;
            }
            goto LAB_00adeeba;
          }
        }
      }
      pvVar8 = FrameDisplay::GetItem(pFStack_58,uVar11 - 1);
      pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
      uVar11 = local_34;
      pPVar10 = ScriptContext::GetPropertyName(pSVar13,local_34);
      Output::Trace(ConsoleScopePhase,L"Adding property \'%s\' to console scope object\n",
                    pPVar10 + 1);
      bVar4 = false;
      newValue = local_50;
      goto LAB_00adee9f;
    }
  }
  bVar4 = VarIs<Js::RecyclableObject>(defaultInstance);
  pSVar13 = local_40;
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xcd8,"(!TaggedNumber::Is(defaultInstance))",
                                "Root object is an int or tagged float?");
    if (!bVar4) goto LAB_00adeeba;
    *puVar7 = 0;
  }
  if (defaultInstance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xcd9,"(defaultInstance != nullptr)","defaultInstance != nullptr");
    if (!bVar4) {
LAB_00adeeba:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pRVar9 = VarTo<Js::RecyclableObject>(defaultInstance);
  propertyOperationFlags = propertyOperationFlags | PropertyOperation_Root;
  bVar4 = true;
  uVar11 = local_34;
LAB_00adee9f:
  info2.propertyRecordUsageCache._5_1_ = 1;
  info2.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info2.prop = (RecyclableObject *)0x0;
  info2.functionBody = (FunctionBody *)0x0;
  info2.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info2.inlineCache = (InlineCache *)0x0;
  info2.m_propertyIndex = 0;
  info2.m_attributes = '\0';
  info2.flags = InlineCacheNoFlags;
  info2.cacheInfoFlag = 0;
  info2.m_instance = (RecyclableObject *)0x50000ffff;
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  SetProperty_Internal<false>
            (pRVar9,pRVar9,bVar4,uVar11,newValue,(PropertyValueInfo *)&info.inlineCacheIndex,pSVar13
             ,propertyOperationFlags);
  return;
}

Assistant:

inline void JavascriptOperators::PatchSetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var newValue, Var defaultInstance, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchSetPropertyScoped);
        // Set the property using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property and store
        // the new value there.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        uint16 length = pDisplay->GetLength();
        RecyclableObject *object;

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);

        bool allowUndecInConsoleScope = (propertyOperationFlags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_AllowUndeclInConsoleScope;
        bool isLexicalThisSlotSymbol = (propertyId == PropertyIds::_this);

        for (uint16 i = 0; i < length; i++)
        {
            object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            AssertMsg(!VarIs<ConsoleScopeActivationObject>(object) || (i == length - 1), "Invalid location for ConsoleScopeActivationObject");

            Type* type = object->GetType();
            if (CacheOperators::TrySetProperty<true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                    object, false, propertyId, newValue, scriptContext, propertyOperationFlags, nullptr, &info))
            {
                return;
            }

            // In scoped set property, we need to set the property when it is available; it could be a setter
            // or normal property. we need to check setter first, and if no setter is available, but HasProperty
            // is true, this must be a normal property.
            // TODO: merge OP_HasProperty and GetSetter in one pass if there is perf problem. In fastDOM we have quite
            // a lot of setters so separating the two might be actually faster.
            BOOL setAccessorResult = FALSE;
            if (SetAccessorOrNonWritableProperty(object, object, propertyId, newValue, &info, scriptContext, propertyOperationFlags, false, allowUndecInConsoleScope, &setAccessorResult))
            {
                return;
            }
            else if (!JavascriptOperators::IsObject(object))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
            }

            // Need to do a "get" of the current value (if any) to make sure that we're not writing to
            // let/const before declaration, but we need to disable implicit calls around the "get",
            // so we need to do a "has" first to make sure the "get" is valid (e.g., "get" on a HostDispatch
            // with implicit calls disabled will always "succeed").
            if (JavascriptOperators::HasProperty(object, propertyId))
            {
                DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);

                Var value;
                BOOL result = JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, nullptr);

                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);

                if (result && scriptContext->IsUndeclBlockVar(value) && !allowUndecInConsoleScope && !isLexicalThisSlotSymbol)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }

                PropertyValueInfo info2;
                PropertyValueInfo::SetCacheInfo(&info2, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
                PropertyOperationFlags setPropertyOpFlags = allowUndecInConsoleScope ? PropertyOperation_AllowUndeclInConsoleScope : PropertyOperation_None;
                object->SetProperty(propertyId, newValue, setPropertyOpFlags, &info2);

#if DBG_DUMP
                if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
                {
                    CacheOperators::TraceCache(inlineCache, _u("PatchSetPropertyScoped"), propertyId, scriptContext, object);
                }
#endif
                if (!VarIs<JavascriptProxy>(object) && !allowUndecInConsoleScope)
                {
                    CacheOperators::CachePropertyWrite(object, false, type, propertyId, &info2, scriptContext);
                }

                return;
            }
        }

        Assert(!isLexicalThisSlotSymbol);

        // If we have console scope and no one in the scope had the property add it to console scope
        if ((length > 0) && VarIs<ConsoleScopeActivationObject>(pDisplay->GetItem(length - 1)))
        {
            // CheckPrototypesForAccessorOrNonWritableProperty does not check for const in global object. We should check it here.
            if (length > 1)
            {
                Js::GlobalObject * globalObject = JavascriptOperators::TryFromVar<Js::GlobalObject>(pDisplay->GetItem(length - 2));
                if (globalObject)
                {
                    Var setterValue = nullptr;

                    DescriptorFlags flags = JavascriptOperators::GetRootSetter(globalObject, propertyId, &setterValue, &info, scriptContext);
                    Assert((flags & Accessor) != Accessor);
                    Assert((flags & Proxy) != Proxy);
                    if ((flags & Data) == Data && (flags & Writable) == None)
                    {
                        if (!allowUndecInConsoleScope)
                        {
                            if (flags & Const)
                            {
                                JavascriptError::ThrowTypeError(scriptContext, ERRAssignmentToConst);
                            }
                            Assert(!isLexicalThisSlotSymbol);
                            return;
                        }
                    }
                }
            }

            RecyclableObject* obj = VarTo<RecyclableObject>(pDisplay->GetItem(length - 1));
            OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Adding property '%s' to console scope object\n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
            JavascriptOperators::SetProperty(obj, obj, propertyId, newValue, scriptContext, propertyOperationFlags);
            return;
        }

        // No one in the scope stack has the property, so add it to the default instance provided by the caller.
        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        Assert(defaultInstance != nullptr);
        RecyclableObject* obj = VarTo<RecyclableObject>(defaultInstance);
        {
            //SetPropertyScoped does not use inline cache for default instance
            PropertyValueInfo info2;
            JavascriptOperators::SetRootProperty(obj, propertyId, newValue, &info2, scriptContext, (PropertyOperationFlags)(propertyOperationFlags | PropertyOperation_Root));
        }
        JIT_HELPER_END(Op_PatchSetPropertyScoped);
    }